

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::tcSetLeastSignificantBits(WordType *dst,uint parts,uint bits)

{
  uint local_1c;
  uint local_18;
  uint i;
  uint bits_local;
  uint parts_local;
  WordType *dst_local;
  
  local_1c = 0;
  for (local_18 = bits; 0x40 < local_18; local_18 = local_18 - 0x40) {
    dst[local_1c] = 0xffffffffffffffff;
    local_1c = local_1c + 1;
  }
  if (local_18 != 0) {
    dst[local_1c] = 0xffffffffffffffff >> (0x40U - (char)local_18 & 0x3f);
    local_1c = local_1c + 1;
  }
  while (local_1c < parts) {
    dst[local_1c] = 0;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void APInt::tcSetLeastSignificantBits(WordType *dst, unsigned parts,
                                      unsigned bits) {
  unsigned i = 0;
  while (bits > APINT_BITS_PER_WORD) {
    dst[i++] = ~(WordType) 0;
    bits -= APINT_BITS_PER_WORD;
  }

  if (bits)
    dst[i++] = ~(WordType) 0 >> (APINT_BITS_PER_WORD - bits);

  while (i < parts)
    dst[i++] = 0;
}